

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O2

bool P_CheckPosition(AActor *thing,DVector2 *pos,FCheckPosition *tm,bool actorsonly)

{
  double *pdVar1;
  uint uVar2;
  uint uVar3;
  sector_t *this;
  F3DFloor *pFVar4;
  DAngle angle;
  DAngle angle_00;
  bool bVar5;
  int iVar6;
  int iVar7;
  sector_t *psVar8;
  undefined8 extraout_RAX;
  line_t *plVar9;
  byte bVar10;
  byte bVar11;
  FBoundingBox *box;
  AActor *pAVar12;
  undefined4 uVar13;
  FMultiBlockThingsIterator *it_00;
  FBoundingBox *this_00;
  uint i;
  line_t *plVar14;
  ulong uVar15;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 uVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  AActor *local_470;
  double zofs;
  double local_460;
  double local_458;
  double dStack_450;
  CheckResult lcres;
  FName local_410;
  FName local_40c;
  double local_408;
  undefined8 uStack_400;
  FBoundingBox local_3f8;
  line_t *local_3d0;
  DVector2 local_3c8;
  double local_3b8;
  int local_3b0;
  FLineOpening open;
  FBlockLinesIterator it_1;
  DVector2 ref;
  FPortalGroupArray pcheck;
  CheckResult tcres;
  FMultiBlockLinesIterator it;
  FMultiBlockThingsIterator it2;
  
  local_460 = thing->Height;
  tm->thing = thing;
  dVar19 = pos->Y;
  (tm->pos).X = pos->X;
  (tm->pos).Y = dVar19;
  (tm->pos).Z = (thing->__Pos).Z;
  psVar8 = P_PointInSector(pos);
  tm->sector = psVar8;
  thing->BlockingLine = (line_t *)0x0;
  tm->ceilingline = (line_t *)0x0;
  bVar5 = AActor::IsNoClip2(thing);
  if (bVar5) {
    dVar19 = sector_t::LowestFloorAt(psVar8,pos,&tm->floorsector);
    tm->dropoffz = dVar19;
    tm->floorz = dVar19;
    dVar19 = sector_t::HighestCeilingAt(psVar8,pos,&tm->ceilingsector);
    tm->ceilingz = dVar19;
    this = tm->floorsector;
    (tm->floorpic).texnum = this->planes[0].Texture.texnum;
    iVar6 = sector_t::GetTerrain(this,0);
    tm->floorterrain = iVar6;
    (tm->ceilingpic).texnum = tm->ceilingsector->planes[1].Texture.texnum;
  }
  else {
    if (((psVar8->planes[1].Flags & 0x1d0U) == 0x100) ||
       ((psVar8->planes[0].Flags & 0x1d0U) == 0x100)) {
      P_GetFloorCeilingZ(tm,2);
    }
    else {
      dVar19 = secplane_t::ZatPoint(&psVar8->floorplane,pos);
      tm->dropoffz = dVar19;
      tm->floorz = dVar19;
      (tm->floorpic).texnum = psVar8->planes[0].Texture.texnum;
      dVar19 = secplane_t::ZatPoint(&psVar8->ceilingplane,pos);
      tm->ceilingz = dVar19;
      (tm->ceilingpic).texnum = psVar8->planes[1].Texture.texnum;
      tm->ceilingsector = psVar8;
      tm->floorsector = psVar8;
      iVar6 = sector_t::GetTerrain(psVar8,0);
      tm->floorterrain = iVar6;
    }
    uVar15 = -(ulong)(0.0 < thing->Height);
    local_458 = (double)(~uVar15 & 0x3ff0000000000000 | (ulong)thing->Height & uVar15) +
                (thing->__Pos).Z;
    dStack_450 = 0.0;
    for (uVar15 = 0; uVar15 < (psVar8->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count
        ; uVar15 = uVar15 + 1) {
      pFVar4 = (psVar8->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar15];
      if ((~pFVar4->flags & 3) == 0) {
        dVar19 = secplane_t::ZatPoint((pFVar4->bottom).plane,pos);
        dVar17 = secplane_t::ZatPoint((pFVar4->top).plane,pos);
        dVar18 = (dVar17 - dVar19) * 0.5 + dVar19;
        dVar20 = (thing->__Pos).Z - dVar18;
        dVar18 = local_458 - dVar18;
        if ((tm->floorz <= dVar17 && dVar17 != tm->floorz) && (ABS(dVar20) < ABS(dVar18))) {
          tm->dropoffz = dVar17;
          tm->floorz = dVar17;
          (tm->floorpic).texnum = ((pFVar4->top).texture)->texnum;
          uStack_400 = 0;
          local_408 = dVar20;
          iVar6 = sector_t::GetTerrain(pFVar4->model,(pFVar4->top).isceiling);
          tm->floorterrain = iVar6;
          dVar20 = local_408;
        }
        if ((dVar19 < tm->ceilingz) && (ABS(dVar18) <= ABS(dVar20))) {
          tm->ceilingz = dVar19;
          (tm->ceilingpic).texnum = ((pFVar4->bottom).texture)->texnum;
        }
      }
    }
  }
  tm->touchmidtex = false;
  tm->abovemidtex = false;
  validcount = validcount + 1;
  if (((thing->flags).Value & 0x1001000) == 0x1000) {
    return true;
  }
  thing->BlockingMobj = (AActor *)0x0;
  if (thing->player == (player_t *)0x0) {
    dVar19 = thing->Height;
  }
  else {
    dVar19 = thing->MaxStepHeight + local_460;
    thing->Height = dVar19;
  }
  tm->stepthing = (AActor *)0x0;
  pcheck.data.Array = (unsigned_short *)0x0;
  pcheck.data.Most = 0;
  pcheck.data.Count = 0;
  pcheck.method = 1;
  pcheck.varused = '\0';
  pcheck.inited = false;
  FMultiBlockThingsIterator::FMultiBlockThingsIterator
            (&it2,&pcheck,pos->X,pos->Y,(thing->__Pos).Z,dVar19,thing->radius,false,psVar8);
  local_470 = (AActor *)0x0;
  while (it_00 = &it2, bVar5 = FMultiBlockThingsIterator::Next(&it2,&tcres), bVar5) {
    bVar5 = PIT_CheckThing(it_00,&tcres,box,tm);
    if (!bVar5) {
      pAVar12 = thing->BlockingMobj;
      if (((pAVar12 == (AActor *)0x0) || (((byte)i_compatflags & 0x10) != 0)) ||
         (((byte)tcres.portalflags & 0x80) != 0)) {
LAB_004acc3d:
        thing->Height = local_460;
        goto LAB_004acc4b;
      }
      if (((pAVar12->player != (player_t *)0x0) || (((thing->flags).Value & 0x1014000) != 0)) ||
         (dVar19 = (pAVar12->__Pos).Z,
         thing->MaxStepHeight < (pAVar12->Height + dVar19) - (thing->__Pos).Z)) {
        if (((thing->player == (player_t *)0x0) ||
            (thing->MaxStepHeight < ((thing->__Pos).Z + thing->Height) - (pAVar12->__Pos).Z)) ||
           (local_470 != (AActor *)0x0)) goto LAB_004acc3d;
        local_470 = (AActor *)0x0;
      }
      else if ((local_470 == (AActor *)0x0) ||
              (pdVar1 = &(local_470->__Pos).Z, *pdVar1 <= dVar19 && dVar19 != *pdVar1)) {
        local_470 = pAVar12;
      }
      thing->BlockingMobj = (AActor *)0x0;
    }
  }
  validcount = validcount + 1;
  thing->BlockingMobj = (AActor *)0x0;
  thing->Height = local_460;
  if ((actorsonly) || (((thing->flags).Value & 0x1000) != 0)) {
    thing->BlockingMobj = local_470;
LAB_004aca37:
    bVar5 = local_470 == (AActor *)0x0;
  }
  else {
    TArray<spechit_t,_spechit_t>::Clear(&spechit);
    TArray<spechit_t,_spechit_t>::Clear(&portalhit);
    FMultiBlockLinesIterator::FMultiBlockLinesIterator
              (&it,&pcheck,pos->X,pos->Y,(thing->__Pos).Z,thing->Height,thing->radius,psVar8);
    dVar19 = tm->floorz;
    tm->floorz = tm->dropoffz;
    local_408 = (double)CONCAT44(local_408._4_4_,(int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1));
    while (bVar5 = FMultiBlockLinesIterator::Next(&it,&lcres), plVar14 = lcres.line, bVar5) {
      bVar5 = FBoundingBox::inRange(&it.bbox,lcres.line);
      if (bVar5) {
        this_00 = &it.bbox;
        iVar6 = FBoundingBox::BoxOnLineSide(this_00,plVar14);
        plVar9 = lcres.line;
        if (iVar6 != -1) goto LAB_004ac076;
        if (plVar14->backsector == (sector_t *)0x0) {
          bVar5 = line_t::isLinePortal(lcres.line);
          iVar6 = lcres.portalflags;
          plVar9 = lcres.line;
          if ((bVar5) && (((lcres.line)->sidedef[0]->Flags & 0x40) != 0)) {
            open.top = (double)plVar14;
            open.lowfloor = lcres.Position.X;
            open.bottomsec = (sector_t *)lcres.Position.Y;
            AActor::PosRelative((DVector3 *)&it_1,tm->thing,plVar14);
            open.bottom = (double)it_1._0_8_;
            open.range = (double)it_1._8_8_;
            TArray<spechit_t,_spechit_t>::Push(&portalhit,(spechit_t *)&open);
          }
          else {
            pAVar12 = tm->thing;
            uVar13 = extraout_XMM0_Da_00;
            uVar16 = extraout_XMM0_Db_00;
            if ((((lcres.portalflags & 0x20U) == 0) ||
                (iVar7 = LineIsAbove(lcres.line,pAVar12), uVar13 = extraout_XMM0_Da_01,
                uVar16 = extraout_XMM0_Db_01, iVar7 == 0)) &&
               (((iVar6 & 0x40U) == 0 ||
                (iVar6 = LineIsBelow(plVar9,pAVar12), uVar13 = extraout_XMM0_Da_02,
                uVar16 = extraout_XMM0_Db_02, iVar6 == 0)))) {
              psVar8 = plVar9->frontsector;
              if ((psVar8->planes[1].Flags & 0x1d0U) == 0x100) {
                dVar17 = sectorPortals.Array[psVar8->Portals[1]].mPlaneZ;
                uVar13 = SUB84(dVar17,0);
                uVar16 = (undefined4)((ulong)dVar17 >> 0x20);
                dVar20 = (pAVar12->__Pos).Z;
                if (((dVar20 < dVar17) && (dVar17 <= dVar20 + pAVar12->MaxStepHeight)) &&
                   (tm->floorz <= dVar17 && dVar17 != tm->floorz)) {
                  tm->floorz = dVar17;
                  tm->floorsector = psVar8;
                  (tm->floorpic).texnum = plVar9->sidedef[0]->textures[1].texture.texnum;
                  tm->floorterrain = 0;
                  tm->portalstep = true;
                  goto LAB_004ac076;
                }
              }
              if (((pAVar12->flags2).Value & 8) != 0) {
                local_40c.Index = 0x84;
                zofs = 0.0;
                angle.Degrees._4_4_ = uVar16;
                angle.Degrees._0_4_ = uVar13;
                P_DamageMobj(pAVar12,(AActor *)0x0,(AActor *)0x0,pAVar12->Mass >> 5,&local_40c,0,
                             angle);
                pAVar12 = tm->thing;
              }
              pAVar12->BlockingLine = plVar14;
              CheckForPushSpecial(plVar14,0,pAVar12,(DVector2 *)0x0);
              goto LAB_004aca1b;
            }
          }
          goto LAB_004ac076;
        }
        pAVar12 = tm->thing;
        uVar2 = (pAVar12->flags).Value;
        bVar11 = 1;
        bVar10 = 1;
        if ((uVar2 >> 0x10 & 1) == 0) {
          bVar10 = (*(byte *)((long)&(pAVar12->BounceFlags).Value + 1) & 0x10) >> 4;
        }
        if (((pAVar12->flags3).Value & 0x100000) == 0) {
          if ((i_compatflags._3_1_ & 4) == 0) {
            bVar11 = 0;
          }
          else {
            bVar11 = (byte)(uVar2 >> 0x1b) & 1;
          }
        }
        uVar3 = plVar14->flags;
        if ((bVar10 & (uVar3 & 0x1008000) == 0) == 0) {
          uVar13 = (undefined4)CONCAT71((int7)((ulong)this_00 >> 8),1);
          if (((uVar3 >> 0x11 & 1) == 0) &&
             (((((uVar3 & 0x8001) != 0 || ((byte)(~bVar11 & (byte)((uVar3 & 2) >> 1)) != 0)) ||
               (((uVar3 >> 0xe & 1) != 0 && (pAVar12->player != (player_t *)0x0)))) ||
              (((bVar10 & (byte)(uVar3 >> 0x18) & 1) != 0 ||
               ((uVar13 = 0, (uVar2 >> 0xe & 1) != 0 && ((uVar3 & 0x40000) != 0)))))))) {
            if ((lcres.portalflags & 0x20U) == 0) {
              if ((lcres.portalflags & 0x40U) == 0) {
                if (((pAVar12->flags2).Value & 8) != 0) {
                  local_410.Index = 0x84;
                  angle_00.Degrees._4_4_ = extraout_XMM0_Db;
                  angle_00.Degrees._0_4_ = extraout_XMM0_Da;
                  P_DamageMobj(pAVar12,(AActor *)0x0,(AActor *)0x0,pAVar12->Mass >> 5,&local_410,0,
                               angle_00);
                  pAVar12 = tm->thing;
                }
                pAVar12->BlockingLine = plVar14;
                open.top = lcres.Position.X;
                open.bottom = lcres.Position.Y;
                iVar6 = P_PointOnLineSide((DVector2 *)&open,plVar14);
                CheckForPushSpecial(plVar14,iVar6,tm->thing,(DVector2 *)0x0);
                goto LAB_004aca1b;
              }
              iVar6 = LineIsBelow(lcres.line,pAVar12);
              if (iVar6 != -1) {
                if (iVar6 != 1) goto LAB_004ac2ae;
                psVar8 = plVar9->frontsector;
                dVar17 = sectorPortals.Array[psVar8->Portals[1]].mPlaneZ;
                if (tm->floorz <= dVar17 && dVar17 != tm->floorz) {
                  tm->floorz = dVar17;
                  tm->floorsector = psVar8;
                  tm->floorterrain = 0;
                }
              }
            }
            else {
              iVar6 = LineIsAbove(lcres.line,pAVar12);
              if (iVar6 != -1) {
                if (iVar6 != 1) goto LAB_004ac2ae;
                psVar8 = plVar9->frontsector;
                if (sectorPortals.Array[psVar8->Portals[0]].mPlaneZ < tm->ceilingz) {
                  tm->ceilingz = sectorPortals.Array[psVar8->Portals[0]].mPlaneZ;
                  tm->ceilingsector = psVar8;
                }
              }
            }
            goto LAB_004ac076;
          }
        }
        else {
LAB_004ac2ae:
          uVar13 = 0;
        }
        local_458 = (double)CONCAT44(local_458._4_4_,uVar13);
        open.top = lcres.Position.X;
        open.bottom = lcres.Position.Y;
        FindRefPoint(plVar14,(DVector2 *)&open);
        P_LineOpening(&open,pAVar12,plVar14,&ref,(DVector2 *)&lcres.Position,lcres.portalflags);
        if ((((tm->thing->flags).Value & 0x1600) != 0) ||
           (open.frontfloorplane.normal.Z < 0.707122802734375 !=
            0.707122802734375 <= open.backfloorplane.normal.Z)) {
          bVar5 = secplane_t::operator==(&open.frontfloorplane,&open.backfloorplane);
          dVar17 = 0.0;
          if (bVar5 && -3.4028234663852886e+38 < open.bottom) {
            dVar17 = open.frontfloorplane.normal.Y * lcres.Position.Y;
            open.bottom = (dVar17 + open.frontfloorplane.D +
                                    open.frontfloorplane.normal.X * lcres.Position.X) *
                          open.frontfloorplane.negiC;
          }
          if (local_458._0_1_ != '\0') {
            if ((level.flags2._2_1_ & 0x20) != 0) {
              local_458 = open.bottom;
              dStack_450 = dVar17;
              dVar17 = secplane_t::ZatPoint(&tm->thing->Sector->floorplane,&ref);
              if ((local_458 != dVar17) || (NAN(local_458) || NAN(dVar17))) goto LAB_004ac4c5;
            }
            open.bottom = open.bottom + 32.0;
          }
LAB_004ac4c5:
          if (((lcres.portalflags & 0x40U) == 0) && (open.top < tm->ceilingz)) {
            tm->ceilingz = open.top;
            tm->ceilingsector = open.topsec;
            (tm->ceilingpic).texnum = open.ceilingpic.texnum;
            tm->ceilingline = plVar14;
            tm->thing->BlockingLine = plVar14;
          }
          if ((lcres.portalflags & 0x20U) == 0) {
            pdVar1 = &tm->floorz;
            if (open.bottom < *pdVar1 || open.bottom == *pdVar1) {
              if ((open.bottom == *pdVar1) && (!NAN(open.bottom) && !NAN(*pdVar1))) {
                tm->touchmidtex = (bool)(tm->touchmidtex | open.touchmidtex);
                tm->abovemidtex = (bool)(tm->abovemidtex | open.abovemidtex);
              }
            }
            else {
              tm->floorz = open.bottom;
              tm->floorsector = open.bottomsec;
              (tm->floorpic).texnum = open.floorpic.texnum;
              tm->floorterrain = open.floorterrain;
              tm->touchmidtex = open.touchmidtex;
              tm->abovemidtex = open.abovemidtex;
              tm->thing->BlockingLine = plVar14;
            }
            if (open.lowfloor < tm->dropoffz) {
              tm->dropoffz = open.lowfloor;
            }
          }
          if (plVar14->special != 0) {
            it_1._0_8_ = plVar14;
            it_1.polyLink = (polyblock_t *)lcres.Position.X;
            it_1._32_8_ = lcres.Position.Y;
            AActor::PosRelative((DVector3 *)&local_3f8,tm->thing,plVar14);
            it_1._8_8_ = local_3f8.m_Box[0];
            it_1._16_8_ = local_3f8.m_Box[1];
            TArray<spechit_t,_spechit_t>::Push(&spechit,(spechit_t *)&it_1);
          }
          bVar5 = line_t::isLinePortal(plVar14);
          if (bVar5) {
            it_1._0_8_ = plVar14;
            it_1.polyLink = (polyblock_t *)lcres.Position.X;
            it_1._32_8_ = lcres.Position.Y;
            AActor::PosRelative((DVector3 *)&local_3f8,tm->thing,plVar14);
            it_1._8_8_ = local_3f8.m_Box[0];
            it_1._16_8_ = local_3f8.m_Box[1];
            TArray<spechit_t,_spechit_t>::Push(&portalhit,(spechit_t *)&it_1);
          }
          goto LAB_004ac076;
        }
LAB_004aca1b:
        local_408 = (double)((ulong)local_408 & 0xffffffff00000000);
      }
      else {
LAB_004ac076:
        uVar2 = (lcres.line)->portalindex;
        if (((linePortals.Array != (FLinePortal *)0x0 && uVar2 < linePortals.Count) &&
            ((linePortals.Array[uVar2].mFlags & 2) != 0)) &&
           (linePortals.Array[uVar2].mType != '\x03')) {
          local_3d0 = lcres.line;
          local_3c8.X = lcres.Position.X;
          local_3c8.Y = lcres.Position.Y;
          local_3b8 = lcres.Position.Z;
          local_3b0 = lcres.portalflags;
          if ((((lcres.portalflags & 0x60U) == 0) &&
              (bVar5 = FBoundingBox::inRange(&it.bbox,lcres.line), bVar5)) &&
             (iVar6 = FBoundingBox::BoxOnLineSide(&it.bbox,local_3d0), iVar6 == -1)) {
            if (local_3d0->portalindex < linePortals.Count) {
              plVar14 = linePortals.Array[local_3d0->portalindex].mDestination;
            }
            else {
              plVar14 = (line_t *)0x0;
            }
            zofs = 0.0;
            P_TranslatePortalXY(local_3d0,&local_3c8.X,&local_3c8.Y);
            P_TranslatePortalZ(local_3d0,&zofs);
            psVar8 = plVar14->backsector;
            if (psVar8 == (sector_t *)0x0) {
              plVar14->backsector = plVar14->frontsector;
            }
            pAVar12 = tm->thing;
            (pAVar12->__Pos).Z = zofs + (pAVar12->__Pos).Z;
            local_3f8.m_Box[2] = pAVar12->radius;
            local_3f8.m_Box[0] = local_3c8.Y + local_3f8.m_Box[2];
            local_3f8.m_Box[3] = local_3c8.X + local_3f8.m_Box[2];
            local_3f8.m_Box[1] = local_3c8.Y - local_3f8.m_Box[2];
            local_3f8.m_Box[2] = local_3c8.X - local_3f8.m_Box[2];
            FBlockLinesIterator::FBlockLinesIterator(&it_1,&local_3f8);
            local_458 = (double)((ulong)local_458 & 0xffffffff00000000);
            while (plVar9 = FBlockLinesIterator::Next(&it_1), plVar9 != (line_t *)0x0) {
              bVar5 = FBoundingBox::inRange(&local_3f8,plVar9);
              if (((bVar5) && (iVar6 = FBoundingBox::BoxOnLineSide(&local_3f8,plVar9), iVar6 == -1))
                 && (plVar9->backsector != (sector_t *)0x0)) {
                open.top = local_3c8.X;
                open.bottom = local_3c8.Y;
                FindRefPoint(plVar9,(DVector2 *)&open);
                P_LineOpening(&open,tm->thing,plVar9,&ref,&local_3c8,0);
                if (open.top - zofs < tm->ceilingz) {
                  tm->ceilingz = open.top - zofs;
                  (tm->ceilingpic).texnum = open.ceilingpic.texnum;
                  local_458 = (double)CONCAT44(local_458._4_4_,
                                               (int)CONCAT71((uint7)(uint3)((uint)open.ceilingpic.
                                                                                  texnum >> 8),1));
                }
                dVar17 = open.bottom - zofs;
                if (tm->floorz <= dVar17 && dVar17 != tm->floorz) {
                  tm->floorz = dVar17;
                  (tm->floorpic).texnum = open.floorpic.texnum;
                  tm->floorterrain = open.floorterrain;
                  local_458 = (double)CONCAT44(local_458._4_4_,
                                               (int)CONCAT71((uint7)(uint3)((uint)open.floorterrain
                                                                           >> 8),1));
                }
                if (open.lowfloor - zofs < tm->dropoffz) {
                  tm->dropoffz = open.lowfloor - zofs;
                }
              }
            }
            pAVar12 = tm->thing;
            (pAVar12->__Pos).Z = (pAVar12->__Pos).Z - zofs;
            plVar14->backsector = psVar8;
            if (((ulong)local_458 & 1) != 0) {
              pAVar12->BlockingLine = lcres.line;
            }
          }
        }
      }
    }
    if (((ulong)local_408 & 1) != 0) {
      dVar17 = tm->floorz;
      uVar13 = SUB84(dVar17,0);
      uVar16 = (undefined4)((ulong)dVar17 >> 0x20);
      if (thing->Height <= tm->ceilingz - dVar17) {
        if (tm->touchmidtex == false) {
          uVar13 = SUB84(dVar19,0);
          uVar16 = (undefined4)((ulong)dVar19 >> 0x20);
          if (tm->stepthing != (AActor *)0x0) goto LAB_004acc28;
        }
        else {
LAB_004acc28:
          tm->dropoffz = (double)CONCAT44(uVar16,uVar13);
        }
        thing->BlockingMobj = local_470;
        goto LAB_004aca37;
      }
    }
LAB_004acc4b:
    bVar5 = false;
  }
  TArray<FBlockThingsIterator::HashEntry,_FBlockThingsIterator::HashEntry>::~TArray
            (&it2.blockIterator.DynHash);
  TArray<unsigned_short,_unsigned_short>::~TArray(&pcheck.data);
  return bVar5;
}

Assistant:

bool P_CheckPosition(AActor *thing, const DVector2 &pos, FCheckPosition &tm, bool actorsonly)
{
	sector_t *newsec;
	AActor *thingblocker;
	double realHeight = thing->Height;

	tm.thing = thing;

	tm.pos.X = pos.X;
	tm.pos.Y = pos.Y;
	tm.pos.Z = thing->Z();

	newsec = tm.sector = P_PointInSector(pos);
	tm.ceilingline = thing->BlockingLine = NULL;

	// Retrieve the base floor / ceiling from the target location.
	// Any contacted lines the step closer together will adjust them.
	if (!thing->IsNoClip2())
	{
		if (!newsec->PortalBlocksMovement(sector_t::ceiling) || !newsec->PortalBlocksMovement(sector_t::floor))
		{
			// Use P_GetFloorCeilingZ only if there's portals to consider. Its logic is subtly different than what is needed here for 3D floors.
			P_GetFloorCeilingZ(tm, FFCF_SAMESECTOR);
		}
		else
		{
			tm.floorz = tm.dropoffz = newsec->floorplane.ZatPoint(pos);
			tm.floorpic = newsec->GetTexture(sector_t::floor);
			tm.ceilingz = newsec->ceilingplane.ZatPoint(pos);
			tm.ceilingpic = newsec->GetTexture(sector_t::ceiling);
			tm.floorsector = tm.ceilingsector = newsec;
			tm.floorterrain = newsec->GetTerrain(sector_t::floor);
		}

		F3DFloor*  rover;
		double thingtop = thing->Height > 0 ? thing->Top() : thing->Z() + 1;

		for (unsigned i = 0; i<newsec->e->XFloor.ffloors.Size(); i++)
		{
			rover = newsec->e->XFloor.ffloors[i];
			if (!(rover->flags & FF_SOLID) || !(rover->flags & FF_EXISTS)) continue;

			double ff_bottom = rover->bottom.plane->ZatPoint(pos);
			double ff_top = rover->top.plane->ZatPoint(pos);

			double delta1 = thing->Z() - (ff_bottom + ((ff_top - ff_bottom) / 2));
			double delta2 = thingtop - (ff_bottom + ((ff_top - ff_bottom) / 2));

			if (ff_top > tm.floorz && fabs(delta1) < fabs(delta2))
			{
				tm.floorz = tm.dropoffz = ff_top;
				tm.floorpic = *rover->top.texture;
				tm.floorterrain = rover->model->GetTerrain(rover->top.isceiling);
			}
			if (ff_bottom < tm.ceilingz && fabs(delta1) >= fabs(delta2))
			{
				tm.ceilingz = ff_bottom;
				tm.ceilingpic = *rover->bottom.texture;
			}
		}
	}
	else
	{
		// With noclip2, we must ignore 3D floors and go right to the uppermost ceiling and lowermost floor.
		tm.floorz = tm.dropoffz = newsec->LowestFloorAt(pos, &tm.floorsector);
		tm.ceilingz = newsec->HighestCeilingAt(pos, &tm.ceilingsector);
		tm.floorpic = tm.floorsector->GetTexture(sector_t::floor);
		tm.floorterrain = tm.floorsector->GetTerrain(sector_t::floor);
		tm.ceilingpic = tm.ceilingsector->GetTexture(sector_t::ceiling);
	}

	tm.touchmidtex = false;
	tm.abovemidtex = false;
	validcount++;

	if ((thing->flags & MF_NOCLIP) && !(thing->flags & MF_SKULLFLY))
		return true;

	// Check things first, possibly picking things up.
	thing->BlockingMobj = NULL;
	thingblocker = NULL;
	if (thing->player)
	{ // [RH] Fake taller height to catch stepping up into things.
		thing->Height = realHeight + thing->MaxStepHeight;
	}

	tm.stepthing = NULL;
	FBoundingBox box(pos.X, pos.Y, thing->radius);

	FPortalGroupArray pcheck;
	FMultiBlockThingsIterator it2(pcheck, pos.X, pos.Y, thing->Z(), thing->Height, thing->radius, false, newsec);
	FMultiBlockThingsIterator::CheckResult tcres;

	while ((it2.Next(&tcres)))
	{
		if (!PIT_CheckThing(it2, tcres, it2.Box(), tm))
		{ // [RH] If a thing can be stepped up on, we need to continue checking
			// other things in the blocks and see if we hit something that is
			// definitely blocking. Otherwise, we need to check the lines, or we
			// could end up stuck inside a wall.
			AActor *BlockingMobj = thing->BlockingMobj;

			// If this blocks through a restricted line portal, it will always completely block.
			if (BlockingMobj == NULL || (i_compatflags & COMPATF_NO_PASSMOBJ) || (tcres.portalflags & FFCF_RESTRICTEDPORTAL))
			{ // Thing slammed into something; don't let it move now.
				thing->Height = realHeight;
				return false;
			}
			else if (!BlockingMobj->player && !(thing->flags & (MF_FLOAT | MF_MISSILE | MF_SKULLFLY)) &&
				BlockingMobj->Top() - thing->Z() <= thing->MaxStepHeight)
			{
				if (thingblocker == NULL ||
					BlockingMobj->Z() > thingblocker->Z())
				{
					thingblocker = BlockingMobj;
				}
				thing->BlockingMobj = NULL;
			}
			else if (thing->player &&
				thing->Top() - BlockingMobj->Z() <= thing->MaxStepHeight)
			{
				if (thingblocker)
				{ // There is something to step up on. Return this thing as
					// the blocker so that we don't step up.
					thing->Height = realHeight;
					return false;
				}
				// Nothing is blocking us, but this actor potentially could
				// if there is something else to step on.
				thing->BlockingMobj = NULL;
			}
			else
			{ // Definitely blocking
				thing->Height = realHeight;
				return false;
			}
		}
	}

	// check lines

	// [RH] We need to increment validcount again, because a function above may
	// have already set some lines to equal the current validcount.
	//
	// Specifically, when DehackedPickup spawns a new item in its TryPickup()
	// function, that new actor will set the lines around it to match validcount
	// when it links itself into the world. If we just leave validcount alone,
	// that will give the player the freedom to walk through walls at will near
	// a pickup they cannot get, because their validcount will prevent them from
	// being considered for collision with the player.
	validcount++;

	thing->BlockingMobj = NULL;
	thing->Height = realHeight;
	if (actorsonly || (thing->flags & MF_NOCLIP))
		return (thing->BlockingMobj = thingblocker) == NULL;

	spechit.Clear();
	portalhit.Clear();

	FMultiBlockLinesIterator it(pcheck, pos.X, pos.Y, thing->Z(), thing->Height, thing->radius, newsec);
	FMultiBlockLinesIterator::CheckResult lcres;

	double thingdropoffz = tm.floorz;
	//bool onthing = (thingdropoffz != tmdropoffz);
	tm.floorz = tm.dropoffz;

	bool good = true;

	while (it.Next(&lcres))
	{
		bool thisresult = PIT_CheckLine(it, lcres, it.Box(), tm);
		good &= thisresult;
		if (thisresult)
		{
			FLinePortal *port = lcres.line->getPortal();
			if (port != NULL && port->mFlags & PORTF_PASSABLE && port->mType != PORTT_LINKED)
			{
				// Checking the other side of the portal completely is too costly,
				// but checking the portal's destination line is necessary to 
				// retrieve the proper sector heights on the other side.
				if (PIT_CheckPortal(it, lcres, it.Box(), tm))
				{
					tm.thing->BlockingLine = lcres.line;
				}
			}
		}
	}
	if (!good)
	{
		return false;
	}
	if (tm.ceilingz - tm.floorz < thing->Height)
	{
		return false;
	}
	if (tm.touchmidtex)
	{
		tm.dropoffz = tm.floorz;
	}
	else if (tm.stepthing != NULL)
	{
		tm.dropoffz = thingdropoffz;
	}

	return (thing->BlockingMobj = thingblocker) == NULL;
}